

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

void yaml_document_delete(yaml_document_t *document)

{
  yaml_node_t *pyVar1;
  undefined8 uVar2;
  yaml_char_t *ptr;
  int iStack_78;
  yaml_node_t node;
  yaml_tag_directive_t *tag_directive;
  yaml_document_t *document_local;
  
  if (document == (yaml_document_t *)0x0) {
    __assert_fail("document",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x467,"void yaml_document_delete(yaml_document_t *)");
  }
  while( true ) {
    while( true ) {
      while( true ) {
        if ((document->nodes).start == (document->nodes).top) {
          yaml_free((document->nodes).start);
          (document->nodes).end = (yaml_node_t *)0x0;
          (document->nodes).top = (yaml_node_t *)0x0;
          (document->nodes).start = (yaml_node_t *)0x0;
          yaml_free(document->version_directive);
          for (node.end_mark.column = (size_t)(document->tag_directives).start;
              (yaml_tag_directive_t *)node.end_mark.column != (document->tag_directives).end;
              node.end_mark.column = node.end_mark.column + 0x10) {
            yaml_free(*(void **)node.end_mark.column);
            yaml_free(*(void **)(node.end_mark.column + 8));
          }
          yaml_free((document->tag_directives).start);
          memset(document,0,0x68);
          return;
        }
        pyVar1 = (document->nodes).top;
        (document->nodes).top = pyVar1 + -1;
        uVar2 = *(undefined8 *)(pyVar1 + -1);
        ptr = pyVar1[-1].data.scalar.value;
        yaml_free(pyVar1[-1].tag);
        iStack_78 = (int)uVar2;
        if (iStack_78 != 1) break;
        yaml_free(ptr);
      }
      if (iStack_78 != 2) break;
      yaml_free(ptr);
    }
    if (iStack_78 != 3) break;
    yaml_free(ptr);
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                ,0x477,"void yaml_document_delete(yaml_document_t *)");
}

Assistant:

YAML_DECLARE(void)
yaml_document_delete(yaml_document_t *document)
{
    yaml_tag_directive_t *tag_directive;

    assert(document);   /* Non-NULL document object is expected. */

    while (!STACK_EMPTY(&context, document->nodes)) {
        yaml_node_t node = POP(&context, document->nodes);
        yaml_free(node.tag);
        switch (node.type) {
            case YAML_SCALAR_NODE:
                yaml_free(node.data.scalar.value);
                break;
            case YAML_SEQUENCE_NODE:
                STACK_DEL(&context, node.data.sequence.items);
                break;
            case YAML_MAPPING_NODE:
                STACK_DEL(&context, node.data.mapping.pairs);
                break;
            default:
                assert(0);  /* Should not happen. */
        }
    }
    STACK_DEL(&context, document->nodes);

    yaml_free(document->version_directive);
    for (tag_directive = document->tag_directives.start;
            tag_directive != document->tag_directives.end;
            tag_directive++) {
        yaml_free(tag_directive->handle);
        yaml_free(tag_directive->prefix);
    }
    yaml_free(document->tag_directives.start);

    memset(document, 0, sizeof(yaml_document_t));
}